

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
::_insert_entry(Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *this,ID_index rowIndex,iterator *position)

{
  ID_index local_24;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
  local_20;
  
  local_24 = rowIndex;
  New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
  ::construct<unsigned_int&>
            ((New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
              *)this->entryPool_,&local_24);
  local_20.data_.root_plus_size_.m_header.super_node.prev_ = (position->members_).nodeptr_;
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
  ::insert(&local_20,(const_iterator *)&this->column_,
           (reference)&local_20.data_.root_plus_size_.m_header.super_node.prev_);
  return;
}

Assistant:

inline void Intrusive_list_column<Master_matrix>::_insert_entry(ID_index rowIndex, const iterator& position)
{
  if constexpr (Master_matrix::Option_list::has_row_access) {
    Entry* newEntry = entryPool_->construct(RA_opt::columnIndex_, rowIndex);
    column_.insert(position, *newEntry);
    RA_opt::insert_entry(rowIndex, newEntry);
  } else {
    Entry* newEntry = entryPool_->construct(rowIndex);
    column_.insert(position, *newEntry);
  }
}